

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_things.cpp
# Opt level: O1

void InitClassMap(FClassMap *themap,SpawnMap *thedata)

{
  uint uVar1;
  int iVar2;
  bool bVar3;
  Node *pNVar4;
  PClass *p;
  IPair *pIVar5;
  uint uVar6;
  IPair *unaff_R12;
  uint uVar7;
  ulong uVar8;
  PClassActor *cls;
  FName local_3c;
  PClassActor *local_38;
  
  M_Free(themap->Nodes);
  themap->Nodes = (Node *)0x0;
  themap->LastFree = (Node *)0x0;
  themap->Size = 0;
  themap->NumUsed = 0;
  TMap<int,_PClassActor_*,_THashTraits<int>,_TValueTraits<PClassActor_*>_>::SetNodeVector(themap,1);
  uVar8 = 0;
  uVar6 = 0;
  do {
    uVar1 = thedata->Size;
    uVar7 = (uint)uVar8;
    if (uVar7 < uVar1) {
      pNVar4 = thedata->Nodes + uVar8;
      do {
        pIVar5 = &pNVar4->Pair;
        uVar7 = uVar7 + 1;
        uVar8 = (ulong)uVar7;
        if (*(long *)((long)(pIVar5 + -1) + 0x18) != 1) {
          bVar3 = true;
          unaff_R12 = pIVar5;
          goto LAB_0045cf57;
        }
        pNVar4 = (Node *)(pIVar5 + 1);
      } while (uVar7 != uVar1);
      bVar3 = false;
      uVar8 = (ulong)uVar1;
    }
    else {
      bVar3 = false;
    }
LAB_0045cf57:
    if (!bVar3) {
      if (0 < (int)uVar6) {
        I_Error("%d unknown actor classes found",(ulong)uVar6);
      }
      TMap<int,_MapinfoSpawnItem,_THashTraits<int>,_TValueTraits<MapinfoSpawnItem>_>::
      ClearNodeVector(thedata);
      TMap<int,_MapinfoSpawnItem,_THashTraits<int>,_TValueTraits<MapinfoSpawnItem>_>::SetNodeVector
                (thedata,1);
      return;
    }
    local_38 = (PClassActor *)0x0;
    iVar2 = (unaff_R12->Value).classname.Index;
    if (iVar2 == 0) {
      TMap<int,_PClassActor_*,_THashTraits<int>,_TValueTraits<PClassActor_*>_>::DelKey
                (themap,unaff_R12->Key);
    }
    else {
      local_3c.Index = iVar2;
      p = PClass::FindClass(&local_3c);
      local_38 = dyn_cast<PClassActor>((DObject *)p);
      if (local_38 == (PClassActor *)0x0) {
        Printf("\x1cGScript error, \"%s\" line %d:\nUnknown actor class %s\n",
               (unaff_R12->Value).filename.Chars,(ulong)(uint)(unaff_R12->Value).linenum);
        uVar6 = uVar6 + 1;
      }
      TMap<int,_PClassActor_*,_THashTraits<int>,_TValueTraits<PClassActor_*>_>::Insert
                (themap,unaff_R12->Key,&local_38);
    }
  } while( true );
}

Assistant:

void InitClassMap(FClassMap &themap, SpawnMap &thedata)
{
	themap.Clear();
	SpawnMap::Iterator it(thedata);
	SpawnMap::Pair *pair;
	int error = 0;

	while (it.NextPair(pair))
	{
		PClassActor *cls = NULL;
		if (pair->Value.classname != NAME_None)
		{
			cls = PClass::FindActor(pair->Value.classname);
			if (cls == NULL)
			{
				Printf(TEXTCOLOR_RED "Script error, \"%s\" line %d:\nUnknown actor class %s\n",
					pair->Value.filename.GetChars(), pair->Value.linenum, pair->Value.classname.GetChars());
				error++;
			}
			themap.Insert(pair->Key, cls);
		}
		else
		{
			themap.Remove(pair->Key);
		}
	}
	if (error > 0)
	{
		I_Error("%d unknown actor classes found", error);
	}
	thedata.Clear();	// we do not need this any longer
}